

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QSize __thiscall
QStyleSheetStyle::sizeFromContents
          (QStyleSheetStyle *this,ContentsType ct,QStyleOption *opt,QSize *csz,QWidget *w)

{
  MenuItemType MVar1;
  long lVar2;
  undefined4 uVar3;
  QStyleSheetStyle *pQVar4;
  ulong uVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  QStyle *pQVar12;
  QSize QVar13;
  QStyleOptionButton *pQVar14;
  QStyleOptionComplex *pQVar15;
  qsizetype qVar16;
  QSize QVar17;
  QStyleOptionSpinBox *pQVar18;
  QStyleOptionTab *pQVar19;
  QStyleOptionMenuItem *pQVar20;
  QStyleOptionHeader *pQVar21;
  undefined8 uVar22;
  QAbstractSpinBox *pQVar23;
  QComboBox *pQVar24;
  int iVar25;
  Representation RVar26;
  QVariant *val;
  bool *pbVar27;
  QObject *object;
  ulong uVar28;
  int iVar29;
  Representation RVar30;
  long lVar31;
  long in_FS_OFFSET;
  QRect QVar32;
  undefined1 auVar33 [16];
  QByteArrayView layout;
  QLatin1StringView sh;
  QFontMetrics fm;
  QSize local_1f0;
  QFontMetrics fm_2;
  Representation RStack_1e4;
  QRenderRule subSubRule;
  QRenderRule rule;
  QRenderRule subRule;
  
  pQVar4 = globalStyleSheetStyle;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar12 = baseStyle(this);
    QVar13 = (QSize)(**(code **)(*(long *)pQVar12 + 0xe8))(pQVar12,ct,opt,csz,w);
    uVar28 = (ulong)QVar13 >> 0x20;
    goto LAB_0034ea7d;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&rule,0xaa,0x88);
  renderRule(&rule,this,&w->super_QObject,opt,0);
  local_1f0 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QVar13 = QRenderRule::adjustSize(&rule,csz);
  if (CT_ItemViewItem < ct) goto switchD_0034dd8c_caseD_11;
  local_1f0.wd = QVar13.wd.m_i;
  uVar28 = (ulong)QVar13 >> 0x20;
  local_1f0.ht = QVar13.ht.m_i;
  local_1f0 = QVar13;
  switch(ct) {
  case CT_PushButton:
  case CT_ComboBox:
    goto switchD_0034dd8c_caseD_0;
  case CT_CheckBox:
  case CT_RadioButton:
    pQVar14 = qstyleoption_cast<QStyleOptionButton_const*>(opt);
    QVar13 = local_1f0;
    if ((pQVar14 == (QStyleOptionButton *)0x0) ||
       ((rule.bd.d.ptr == (QStyleSheetBorderData *)0x0 && rule.b.d.ptr == (QStyleSheetBoxData *)0x0
        && (bVar6 = hasStyleRule(this,&w->super_QObject,5), QVar13 = local_1f0, !bVar6))))
    goto switchD_0034dd8c_caseD_11;
    bVar6 = ct == CT_RadioButton;
    uVar3 = 0x43;
    if (bVar6) {
      uVar3 = 0x4a;
    }
    iVar10 = (**(code **)(*(long *)this + 0xe0))(this,bVar6 * '\x02' + '%',pQVar14,w);
    RVar26.m_i = (**(code **)(*(long *)this + 0xe0))(this,bVar6 * '\x02' + '&',pQVar14,w);
    iVar11 = (**(code **)(*(long *)this + 0xe0))(this,uVar3,pQVar14,w);
    if (RVar26.m_i < local_1f0.ht.m_i) {
      RVar26.m_i = local_1f0.ht.m_i;
    }
    local_1f0.ht.m_i = RVar26.m_i;
    local_1f0.wd.m_i = local_1f0.wd.m_i + iVar11 + iVar10;
    goto LAB_0034e6bb;
  case CT_ToolButton:
    if ((rule.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       ((rule.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
        ((*(long *)((long)rule.bd.d.ptr + 0x68) == 0 &&
         (*(int *)((long)rule.bd.d.ptr + 0x38) == 0xc)))))) {
      bVar6 = QRenderRule::baseStyleCanDraw(&rule);
      QVar13 = local_1f0;
      if (bVar6) goto switchD_0034dd8c_caseD_0;
    }
    local_1f0.ht.m_i = local_1f0.ht.m_i + 3;
    local_1f0.wd.m_i = local_1f0.wd.m_i + 3;
    QVar13 = local_1f0;
    goto switchD_0034dd8c_caseD_0;
  case CT_Splitter:
  case CT_MenuBarItem:
    iVar10 = 10;
    if (ct == CT_Splitter) {
      iVar10 = 0x20;
    }
    memset(&subRule,0xaa,0x88);
    renderRule(&subRule,this,&w->super_QObject,opt,iVar10);
    if (subRule.bd.d.ptr == (QStyleSheetBorderData *)0x0 &&
        subRule.b.d.ptr == (QStyleSheetBoxData *)0x0) {
LAB_0034ea2e:
      QRenderRule::~QRenderRule(&subRule);
      QVar13 = local_1f0;
      goto switchD_0034dd8c_caseD_11;
    }
    QVar13 = QRenderRule::boxSize(&subRule,&local_1f0,7);
    QVar17 = QVar13;
LAB_0034ee8c:
    uVar28 = (ulong)QVar17 >> 0x20;
    QRenderRule::~QRenderRule(&subRule);
    break;
  case CT_ProgressBar:
  case CT_SizeGrip:
    bVar6 = QRenderRule::hasContentsSize(&rule);
    if (bVar6) {
      QVar13 = QRenderRule::size(&rule,&local_1f0);
    }
    else {
      pQVar12 = baseStyle(this);
      subRule._0_8_ = (**(code **)(*(long *)pQVar12 + 0xe8))(pQVar12,ct,opt,&local_1f0,w);
      QVar13 = QRenderRule::boxSize(&rule,(QSize *)&subRule,7);
    }
    goto LAB_0034ea5f;
  case CT_MenuItem:
    pQVar20 = qstyleoption_cast<QStyleOptionMenuItem_const*>(opt);
    QVar13 = local_1f0;
    if (pQVar20 != (QStyleOptionMenuItem *)0x0) {
      MVar1 = pQVar20->menuItemType;
      iVar10 = 10;
      if (MVar1 == Separator) {
        iVar10 = 0x26;
      }
      memset(&subRule,0xaa,0x88);
      renderRule(&subRule,this,&w->super_QObject,opt,iVar10);
      if (MVar1 == Separator) {
        bVar6 = QRenderRule::hasContentsSize(&subRule);
        if (!bVar6) goto LAB_0034ea2e;
        QVar13 = (QSize)((ulong)local_1f0 & 0xffffffff);
        QVar17 = QRenderRule::size(&subRule);
      }
      else {
        if ((subRule.bd.d.ptr == (QStyleSheetBorderData *)0x0 &&
             subRule.b.d.ptr == (QStyleSheetBoxData *)0x0) && (subRule.hasFont != true))
        goto LAB_0034ea2e;
        bVar6 = pQVar20->menuHasCheckableItems;
        pQVar24 = QtPrivate::qobject_cast_helper<QComboBox_const*,QObject_const>(&w->super_QObject);
        QVar13 = *csz;
        _fm_2 = QVar13;
        if (subRule.hasFont == true) {
          _fm = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          QFont::resolve((QFont *)&subSubRule);
          QFontMetrics::QFontMetrics(&fm,(QFont *)&subSubRule);
          QFont::~QFont((QFont *)&subSubRule);
          subSubRule.features = 0;
          subSubRule._4_4_ = 0;
          subSubRule.defaultBackground = (QBrush)0xff;
          subSubRule._9_7_ = 0xffffffffffffff;
          auVar33 = QFontMetrics::boundingRect
                              ((QRect *)&fm,(int)&subSubRule,(QString *)0x900,(int)pQVar20 + 0x60,
                               (int *)0x0);
          QVar17.wd.m_i = (auVar33._8_4_ - auVar33._0_4_) + 1;
          uVar9 = (auVar33._12_4_ - auVar33._4_4_) + 1;
          QVar17.ht.m_i = 0;
          if ((int)QVar17.wd.m_i < QVar13.wd.m_i.m_i) {
            QVar17 = (QSize)((ulong)QVar13 & 0xffffffff);
          }
          uVar28 = (ulong)uVar9;
          if ((int)uVar9 < QVar13.ht.m_i.m_i) {
            uVar28 = (ulong)QVar13 >> 0x20;
          }
          _fm_2 = (QSize)((long)QVar17 + (uVar28 << 0x20));
          QFontMetrics::~QFontMetrics(&fm);
          QVar13 = QVar17;
        }
        bVar8 = QString::contains(&pQVar20->text,(QChar)0x9,CaseSensitive);
        RVar26.m_i = QVar13.wd.m_i.m_i + 0xc;
        if (!bVar8) {
          RVar26.m_i = QVar13.wd.m_i.m_i;
        }
        cVar7 = QIcon::isNull();
        if (cVar7 == '\0') {
          subSubRule._4_4_ = (**(code **)(*(long *)this + 0xe0))(this,0x3e,0,0);
          subSubRule.features = subSubRule._4_4_;
          iVar10 = QIcon::actualSize((QSize *)&pQVar20->icon,(Mode)&subSubRule,On);
          if (iVar10 < pQVar20->maxIconWidth) {
            iVar10 = pQVar20->maxIconWidth;
          }
          _fm_2 = iVar10 + RVar26.m_i + 4;
        }
        else if ((pQVar24 == (QComboBox *)0x0) && (bVar6 != false)) {
          memset(&subSubRule,0xaa,0x88);
          renderRule(&subSubRule,this,&w->super_QObject,opt,0x25);
          QVar32 = positionRect(this,w,&subRule,&subSubRule,0x25,&opt->rect,opt->direction);
          iVar10 = (QVar32.x2.m_i.m_i - QVar32.x1.m_i) + 1;
          if (iVar10 < pQVar20->maxIconWidth) {
            iVar10 = pQVar20->maxIconWidth;
          }
          _fm_2 = RVar26.m_i + iVar10 + 4;
          QRenderRule::~QRenderRule(&subSubRule);
        }
        else {
          _fm_2 = RVar26.m_i + pQVar20->maxIconWidth;
        }
        subSubRule._0_8_ = QRenderRule::adjustSize(&subRule,(QSize *)&fm_2);
        QVar13 = QRenderRule::boxSize(&subRule,(QSize *)&subSubRule,7);
        QVar17 = QVar13;
      }
      goto LAB_0034ee8c;
    }
    goto switchD_0034dd8c_caseD_11;
  default:
    if (rule.bd.d.ptr == (QStyleSheetBorderData *)0x0 && rule.b.d.ptr == (QStyleSheetBoxData *)0x0)
    goto switchD_0034dd8c_caseD_11;
    break;
  case CT_TabBarTab:
    memset(&subRule,0xaa,0x88);
    renderRule(&subRule,this,&w->super_QObject,opt,0x2e);
    if (((subRule.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
        ((subRule.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
         ((*(long *)((long)subRule.bd.d.ptr + 0x68) == 0 &&
          (*(int *)((long)subRule.bd.d.ptr + 0x38) == 0xc)))))) && (subRule.hasFont != true)) {
      local_1f0 = QRenderRule::adjustSize(&subRule,csz);
      goto LAB_0034ea2e;
    }
    subSubRule.features = 0;
    subSubRule._4_4_ = 0;
    subSubRule.defaultBackground = (QBrush)0x0;
    subSubRule._9_7_ = 0;
    subSubRule.font = (QFont)0x0;
    subSubRule._17_7_ = 0;
    pQVar19 = qstyleoption_cast<QStyleOptionTab_const*>(opt);
    if (pQVar19 == (QStyleOptionTab *)0x0) {
      bVar6 = false;
      iVar10 = 0;
    }
    else {
      cVar7 = QIcon::isNull();
      iVar10 = 0xc;
      if (cVar7 != '\0') {
        iVar10 = 0;
      }
      bVar6 = (pQVar19->shape - RoundedWest & 0xfffffffa) == 0;
      QString::operator=((QString *)&subSubRule,(QString *)&pQVar19->text);
    }
    if ((subRule.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((subRule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        ((*(long *)((long)subRule.bd.d.ptr + 0x68) != 0 ||
         (*(int *)((long)subRule.bd.d.ptr + 0x38) != 0xc)))))) {
      iVar11 = iVar10;
      if (bVar6 != false) {
        iVar11 = 0;
      }
      iVar25 = 0;
      if (bVar6 != false) {
        iVar25 = iVar10;
      }
      local_1f0.wd.m_i = iVar11 + (csz->wd).m_i;
      local_1f0.ht.m_i = iVar25 + (csz->ht).m_i;
    }
    if (subRule.hasFont == true) {
      iVar10 = QFontMetrics::size((int)opt + 0x20,(QString *)0x800,(int)&subSubRule,(int *)0x0);
      (&local_1f0.wd)[bVar6].m_i = (&local_1f0.wd)[bVar6].m_i - iVar10;
      _fm_2 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QFont::resolve((QFont *)&fm_2);
      _fm = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QFontMetrics::QFontMetrics(&fm,(QFont *)&fm_2);
      uVar22 = QFontMetrics::size((int)&fm,(QString *)0x800,(int)&subSubRule,(int *)0x0);
      iVar10 = (int)((ulong)uVar22 >> 0x20);
      if (bVar6 == false) {
        RVar30.m_i = local_1f0.wd.m_i + (int)uVar22;
        RVar26.m_i = iVar10;
        if (iVar10 < local_1f0.ht.m_i) {
          RVar26.m_i = local_1f0.ht.m_i;
        }
      }
      else {
        RVar26.m_i = local_1f0.ht.m_i + (int)uVar22;
        RVar30.m_i = iVar10;
        if (iVar10 < local_1f0.wd.m_i) {
          RVar30.m_i = local_1f0.wd.m_i;
        }
      }
      local_1f0.ht.m_i = RVar26.m_i;
      local_1f0.wd.m_i = RVar30.m_i;
      QFontMetrics::~QFontMetrics(&fm);
      QFont::~QFont((QFont *)&fm_2);
    }
    _fm_2 = QRenderRule::adjustSize(&subRule,&local_1f0);
    QVar13 = QRenderRule::boxSize(&subRule,(QSize *)&fm_2,7);
    uVar28 = (ulong)QVar13 >> 0x20;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&subSubRule);
    QRenderRule::~QRenderRule(&subRule);
    break;
  case CT_Slider:
    if ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0) ||
       ((rule.b.d.ptr != (QStyleSheetBoxData *)0x0 ||
        (rule.geo.d.ptr != (QStyleSheetGeometryData *)0x0)))) goto LAB_0034e6bb;
    goto switchD_0034dd8c_caseD_11;
  case CT_LineEdit:
  case CT_GroupBox:
    if (w == (QWidget *)0x0) {
      object = (QObject *)0x0;
    }
    else {
      object = *(QObject **)(*(long *)&w->field_0x8 + 0x10);
    }
    pQVar23 = QtPrivate::qobject_cast_helper<QAbstractSpinBox*,QObject>(object);
    if (pQVar23 == (QAbstractSpinBox *)0x0) {
      if ((rule.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
         ((QVar13 = local_1f0, rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
          ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
           (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))))) goto LAB_0034e6bb;
      goto switchD_0034dd8c_caseD_11;
    }
    QVar13 = *csz;
    goto LAB_0034ea5f;
  case CT_SpinBox:
    pQVar18 = qstyleoption_cast<QStyleOptionSpinBox_const*>(opt);
    QVar13 = local_1f0;
    if (pQVar18 == (QStyleOptionSpinBox *)0x0) goto switchD_0034dd8c_caseD_11;
    bVar6 = QRenderRule::baseStyleCanDraw(&rule);
    if (bVar6) {
      pQVar12 = baseStyle(this);
      local_1f0 = (QSize)(**(code **)(*(long *)pQVar12 + 0xe8))(pQVar12,0xf,opt,&local_1f0,w);
    }
    else if (pQVar18->buttonSymbols != NoButtons) {
      memset(&subRule,0xaa,0x88);
      renderRule(&subRule,this,&w->super_QObject,opt,0xb);
      bVar6 = QRenderRule::hasDrawable(&subRule);
      if (bVar6) {
        QVar32 = positionRect(this,w,&rule,&subRule,0xb,&opt->rect,opt->direction);
        RVar26.m_i = ((QVar32.x2.m_i.m_i + local_1f0.wd.m_i) - QVar32.x1.m_i) + 1;
      }
      else {
        QVar13 = QRenderRule::size(&subRule);
        QVar13 = defaultSize(this,w,QVar13,
                             &(pQVar18->super_QStyleOptionComplex).super_QStyleOption.rect,0xb);
        RVar26.m_i = QVar13.wd.m_i.m_i + local_1f0.wd.m_i;
      }
      local_1f0.wd.m_i = RVar26.m_i;
      QRenderRule::~QRenderRule(&subRule);
    }
    QVar13 = local_1f0;
    if (rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 || rule.b.d.ptr != (QStyleSheetBoxData *)0x0)
    {
      local_1f0 = QRenderRule::boxSize(&rule,&local_1f0,7);
      QVar13 = local_1f0;
    }
    goto LAB_0034ea5f;
  case CT_TabWidget:
  case CT_DialogButtons:
    goto switchD_0034dd8c_caseD_11;
  case CT_HeaderSection:
    pQVar21 = qstyleoption_cast<QStyleOptionHeader_const*>(opt);
    QVar13 = local_1f0;
    if (pQVar21 != (QStyleOptionHeader *)0x0) {
      memset(&subRule,0xaa,0x88);
      renderRule(&subRule,this,&w->super_QObject,opt,0x2a);
      if ((subRule.b.d.ptr == (QStyleSheetBoxData *)0x0 &&
           subRule.geo.d.ptr == (QStyleSheetGeometryData *)0x0) &&
         (((subRule.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
           ((*(long *)((long)subRule.bd.d.ptr + 0x68) == 0 &&
            (*(int *)((long)subRule.bd.d.ptr + 0x38) == 0xc)))) && (subRule.hasFont != true)))) {
        bVar6 = QRenderRule::baseStyleCanDraw(&subRule);
        if (bVar6) {
          pQVar12 = baseStyle(this);
          local_1f0 = (QSize)(**(code **)(*(long *)pQVar12 + 0xe8))(pQVar12,0x13,opt,&local_1f0,w);
        }
        else {
          local_1f0 = QWindowsStyle::sizeFromContents
                                ((QWindowsStyle *)this,CT_HeaderSection,opt,&local_1f0,w);
        }
        bVar6 = hasStyleRule(this,&w->super_QObject,0x2c);
        if ((bVar6) ||
           (bVar6 = hasStyleRule(this,&w->super_QObject,0x2b), QVar13 = local_1f0,
           QVar17 = local_1f0, bVar6)) {
          auVar33 = (**(code **)(*(long *)this + 0xc0))(this,0x11,opt,w);
          if (pQVar21->orientation == Horizontal) {
            local_1f0.wd.m_i = local_1f0.wd.m_i + (auVar33._8_4_ - auVar33._0_4_) + 1;
            QVar13 = local_1f0;
            QVar17 = local_1f0;
          }
          else {
            local_1f0.ht.m_i = local_1f0.ht.m_i + (auVar33._12_4_ - auVar33._4_4_) + 1;
            QVar13 = local_1f0;
            QVar17 = local_1f0;
          }
        }
      }
      else {
        local_1f0 = QRenderRule::adjustSize(&subRule,csz);
        if (((ulong)local_1f0 & 0x8000000080000000) != 0) {
          pQVar12 = baseStyle(this);
          uVar22 = (**(code **)(*(long *)pQVar12 + 0xe8))(pQVar12,0x13,opt,&local_1f0,w);
          if (local_1f0.wd.m_i < 0) {
            local_1f0.wd.m_i = (int)uVar22;
          }
          if ((long)local_1f0 < 0) {
            local_1f0.ht.m_i = (int)((ulong)uVar22 >> 0x20);
          }
        }
        if (subRule.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
          cVar7 = QIcon::isNull();
          iVar10 = (**(code **)(*(long *)this + 0xe0))(this,0x2e,pQVar21);
          iVar11 = 0;
          if (cVar7 == '\0') {
            iVar11 = (**(code **)(*(long *)this + 0xe0))(this,0x3e,pQVar21);
          }
          _fm_2 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          QFontMetrics::QFontMetrics(&fm_2,&(pQVar21->super_QStyleOption).fontMetrics);
          if (subRule.hasFont == true) {
            subSubRule._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            subSubRule._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            if (w == (QWidget *)0x0) {
              QFont::QFont((QFont *)&subSubRule,&subRule.font);
            }
            else {
              QFont::resolve((QFont *)&subSubRule);
            }
            QFontMetrics::QFontMetrics(&fm,(QFont *)&subSubRule);
            QVar13 = _fm_2;
            _fm_2 = _fm;
            _fm = QVar13;
            QFontMetrics::~QFontMetrics(&fm);
            QFont::~QFont((QFont *)&subSubRule);
          }
          uVar22 = QFontMetrics::size((int)&fm_2,(QString *)0x0,(int)pQVar21 + 0x48,(int *)0x0);
          iVar25 = (int)((ulong)uVar22 >> 0x20);
          if (iVar25 < iVar11) {
            iVar25 = iVar11;
          }
          RVar26.m_i = iVar25 + iVar10 * 2;
          iVar25 = iVar10;
          if (cVar7 != '\0') {
            iVar25 = 0;
          }
          iVar29 = 0;
          if ((pQVar21->text).d.ptr != (char16_t *)0x0) {
            iVar29 = iVar10;
          }
          RVar30.m_i = iVar10 + iVar11 + (int)uVar22 + iVar25 + iVar29;
          if (RVar30.m_i < local_1f0.wd.m_i) {
            RVar30.m_i = local_1f0.wd.m_i;
          }
          if (RVar26.m_i < local_1f0.ht.m_i) {
            RVar26.m_i = local_1f0.ht.m_i;
          }
          local_1f0.ht.m_i = RVar26.m_i;
          local_1f0.wd.m_i = RVar30.m_i;
          QFontMetrics::~QFontMetrics(&fm_2);
        }
        QVar13 = QRenderRule::size(&subRule,&local_1f0);
        QVar17 = QVar13;
      }
      goto LAB_0034ee8c;
    }
    goto switchD_0034dd8c_caseD_11;
  case CT_MdiControls:
    pQVar15 = qstyleoption_cast<QStyleOptionComplex_const*>(opt);
    QVar13 = local_1f0;
    if ((pQVar15 == (QStyleOptionComplex *)0x0) ||
       (((bVar6 = hasStyleRule(this,&w->super_QObject,0x3e), !bVar6 &&
         (bVar6 = hasStyleRule(this,&w->super_QObject,0x40), !bVar6)) &&
        (bVar6 = hasStyleRule(this,&w->super_QObject,0x3f), QVar13 = local_1f0, !bVar6))))
    goto switchD_0034dd8c_caseD_11;
    subSubRule._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    subSubRule._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    subSubRule._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    sh.m_data = "button-layout";
    sh.m_size = 0xd;
    QRenderRule::styleHint((QVariant *)&subRule,&rule,sh);
    ::QVariant::toList();
    ::QVariant::~QVariant((QVariant *)&subRule);
    if (subSubRule._16_8_ == 0) {
      qVar16 = QByteArrayView::lengthHelperCharArray("mNX",4);
      layout.m_data = "mNX";
      layout.m_size = qVar16;
      subControlLayout((QList<QVariant> *)&subRule,layout);
      QArrayDataPointer<QVariant>::operator=
                ((QArrayDataPointer<QVariant> *)&subSubRule,(QArrayDataPointer<QVariant> *)&subRule)
      ;
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&subRule);
    }
    uVar28 = 0;
    QVar13.wd.m_i = 0;
    QVar13.ht.m_i = 0;
    pbVar27 = (bool *)subSubRule._8_8_;
    for (lVar31 = subSubRule._16_8_ << 5; lVar31 != 0; lVar31 = lVar31 + -0x20) {
      uVar9 = ::QVariant::toInt(pbVar27);
      if ((0xfffffffc < uVar9 - 0x41) &&
         ((knownPseudoElements[uVar9].subControl &
          (pQVar15->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
          super_QFlagsStorage<QStyle::SubControl>.i) != SC_None)) {
        memset(&subRule,0xaa,0x88);
        renderRule(&subRule,this,&w->super_QObject,opt,uVar9);
        QVar17 = QRenderRule::size(&subRule);
        QVar13.wd.m_i = QVar13.wd.m_i.m_i + QVar17.wd.m_i.m_i;
        QVar13.ht.m_i = 0;
        uVar5 = (ulong)QVar17 >> 0x20;
        if (QVar17.ht.m_i.m_i < (int)uVar28) {
          uVar5 = uVar28;
        }
        uVar28 = uVar5;
        QRenderRule::~QRenderRule(&subRule);
      }
      pbVar27 = pbVar27 + 0x20;
    }
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&subSubRule);
    break;
  case CT_ItemViewItem:
    memset(&subRule,0xaa,0x88);
    renderRule(&subRule,this,&w->super_QObject,opt,0x4a);
    pQVar12 = baseStyle(this);
    local_1f0 = (QSize)(**(code **)(*(long *)pQVar12 + 0xe8))(pQVar12,0x16,opt,csz,w);
    QVar13 = QRenderRule::adjustSize(&subRule,&local_1f0);
    if (subRule.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
        subRule.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      local_1f0 = QVar13;
      QVar13 = QRenderRule::boxSize(&subRule,&local_1f0,7);
    }
    uVar28 = (ulong)QVar13 >> 0x20;
    local_1f0 = QVar13;
    QRenderRule::~QRenderRule(&subRule);
  }
LAB_0034ea63:
  QRenderRule::~QRenderRule(&rule);
  if (pQVar4 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
LAB_0034ea7d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (QSize)((ulong)QVar13 & 0xffffffff | uVar28 << 0x20);
switchD_0034dd8c_caseD_11:
  local_1f0 = QVar13;
  pQVar12 = baseStyle(this);
  QVar13 = (QSize)(**(code **)(*(long *)pQVar12 + 0xe8))(pQVar12,ct,opt,&local_1f0,w);
LAB_0034ea5f:
  uVar28 = (ulong)QVar13 >> 0x20;
  goto LAB_0034ea63;
switchD_0034dd8c_caseD_0:
  local_1f0 = QVar13;
  if ((rule.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
     ((rule.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
      ((*(long *)((long)rule.bd.d.ptr + 0x68) == 0 && (*(int *)((long)rule.bd.d.ptr + 0x38) == 0xc))
      )))) {
    bVar6 = QRenderRule::baseStyleCanDraw(&rule);
    if (bVar6) {
      pQVar12 = baseStyle(this);
      local_1f0 = (QSize)(**(code **)(*(long *)pQVar12 + 0xe8))(pQVar12,ct,opt,&local_1f0,w);
    }
    else {
      local_1f0 = QWindowsStyle::sizeFromContents((QWindowsStyle *)this,ct,opt,&local_1f0,w);
    }
    iVar10 = 9;
  }
  else {
    if (ct == CT_ComboBox) {
      memset(&subRule,0xaa,0x88);
      renderRule(&subRule,this,&w->super_QObject,opt,8);
      QVar32 = positionRect(this,w,&rule,&subRule,8,&opt->rect,opt->direction);
      local_1f0.wd.m_i = ((QVar32.x2.m_i.m_i + local_1f0.wd.m_i) - QVar32.x1.m_i) + 3;
      QRenderRule::~QRenderRule(&subRule);
    }
LAB_0034e6bb:
    iVar10 = 7;
  }
  QVar13 = QRenderRule::boxSize(&rule,&local_1f0,iVar10);
  goto LAB_0034ea5f;
}

Assistant:

QSize QStyleSheetStyle::sizeFromContents(ContentsType ct, const QStyleOption *opt,
                                         const QSize &csz, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->sizeFromContents(ct, opt, csz, w))

    QRenderRule rule = renderRule(w, opt);
    QSize sz = rule.adjustSize(csz);

    switch (ct) {
#if QT_CONFIG(spinbox)
    case CT_SpinBox:
        if (const QStyleOptionSpinBox *spinbox = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            if (rule.baseStyleCanDraw()) {
                sz = baseStyle()->sizeFromContents(ct, opt, sz, w);
            } else if (spinbox->buttonSymbols != QAbstractSpinBox::NoButtons) {
                // Add some space for the up/down buttons
                QRenderRule subRule = renderRule(w, opt, PseudoElement_SpinBoxUpButton);
                if (subRule.hasDrawable()) {
                    QRect r = positionRect(w, rule, subRule, PseudoElement_SpinBoxUpButton,
                                           opt->rect, opt->direction);
                    sz.rwidth() += r.width();
                } else {
                    QSize defaultUpSize = defaultSize(w, subRule.size(), spinbox->rect, PseudoElement_SpinBoxUpButton);
                    sz.rwidth() += defaultUpSize.width();
                }
            }
            if (rule.hasBox() || rule.hasBorder() || !rule.hasNativeBorder())
                sz = rule.boxSize(sz);
            return sz;
        }
        break;
#endif // QT_CONFIG(spinbox)
    case CT_ToolButton:
        if (rule.hasBox() || !rule.hasNativeBorder() || !rule.baseStyleCanDraw())
            sz += QSize(3, 3); // ### broken QToolButton
        Q_FALLTHROUGH();
    case CT_ComboBox:
    case CT_PushButton:
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            if (ct == CT_ComboBox) {
                //add some space for the drop down.
                QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                QRect comboRect = positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown, opt->rect, opt->direction);
                //+2 because there is hardcoded margins in QCommonStyle::drawControl(CE_ComboBoxLabel)
                sz += QSize(comboRect.width() + 2, 0);
            }
            return rule.boxSize(sz);
        }
        sz = rule.baseStyleCanDraw() ? baseStyle()->sizeFromContents(ct, opt, sz, w)
                                     : QWindowsStyle::sizeFromContents(ct, opt, sz, w);
        return rule.boxSize(sz, Margin);

    case CT_HeaderSection: {
            if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
                QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewSection);
                if (subRule.hasGeometry() || subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
                    sz = subRule.adjustSize(csz);
                    if (!sz.isValid()) {
                        // Try to set the missing values based on the base style.
                        const auto baseSize = baseStyle()->sizeFromContents(ct, opt, sz, w);
                        if (sz.width() < 0)
                            sz.setWidth(baseSize.width());
                        if (sz.height() < 0)
                            sz.setHeight(baseSize.height());
                    }
                    if (!subRule.hasGeometry()) {
                        QSize nativeContentsSize;
                        bool nullIcon = hdr->icon.isNull();
                        const int margin = pixelMetric(QStyle::PM_HeaderMargin, hdr, w);
                        int iconSize = nullIcon ? 0 : pixelMetric(QStyle::PM_SmallIconSize, hdr, w);
                        QFontMetrics fm = hdr->fontMetrics;
                        if (subRule.hasFont) {
                            QFont styleFont = w ? subRule.font.resolve(w->font()) : subRule.font;
                            fm = QFontMetrics(styleFont);
                        }
                        const QSize txt = fm.size(0, hdr->text);
                        nativeContentsSize.setHeight(margin + qMax(iconSize, txt.height()) + margin);
                        nativeContentsSize.setWidth((nullIcon ? 0 : margin) + iconSize
                                                    + (hdr->text.isNull() ? 0 : margin) + txt.width() + margin);
                        sz = sz.expandedTo(nativeContentsSize);
                    }
                    return subRule.size(sz);
                }
                sz = subRule.baseStyleCanDraw() ? baseStyle()->sizeFromContents(ct, opt, sz, w)
                                                : QWindowsStyle::sizeFromContents(ct, opt, sz, w);
                if (hasStyleRule(w, PseudoElement_HeaderViewDownArrow)
                 || hasStyleRule(w, PseudoElement_HeaderViewUpArrow)) {
                    const QRect arrowRect = subElementRect(SE_HeaderArrow, opt, w);
                    if (hdr->orientation == Qt::Horizontal)
                        sz.rwidth() += arrowRect.width();
                    else
                        sz.rheight() += arrowRect.height();
                }
                return sz;
            }
        }
        break;
    case CT_GroupBox:
    case CT_LineEdit:
#if QT_CONFIG(spinbox)
        if (qobject_cast<QAbstractSpinBox *>(w ? w->parentWidget() : nullptr))
            return csz; // we only care about the size hint of the line edit
#endif
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            return rule.boxSize(sz);
        }
        break;

    case CT_CheckBox:
    case CT_RadioButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
                bool isRadio = (ct == CT_RadioButton);
                int iw = pixelMetric(isRadio ? PM_ExclusiveIndicatorWidth
                                             : PM_IndicatorWidth, btn, w);
                int ih = pixelMetric(isRadio ? PM_ExclusiveIndicatorHeight
                                             : PM_IndicatorHeight, btn, w);

                int spacing = pixelMetric(isRadio ? PM_RadioButtonLabelSpacing
                                                  : PM_CheckBoxLabelSpacing, btn, w);
                sz.setWidth(sz.width() + iw + spacing);
                sz.setHeight(qMax(sz.height(), ih));
                return rule.boxSize(sz);
            }
        }
        break;

    case CT_Menu:
    case CT_MenuBar: // already has everything!
    case CT_ScrollBar:
        if (rule.hasBox() || rule.hasBorder())
            return sz;
        break;

    case CT_MenuItem:
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            PseudoElement pe = (mi->menuItemType == QStyleOptionMenuItem::Separator)
                                    ? PseudoElement_MenuSeparator : PseudoElement_Item;
            QRenderRule subRule = renderRule(w, opt, pe);
            if ((pe == PseudoElement_MenuSeparator) && subRule.hasContentsSize()) {
                return QSize(sz.width(), subRule.size().height());
            }
            if ((pe == PseudoElement_Item) && (subRule.hasBox() || subRule.hasBorder() || subRule.hasFont)) {
                bool drawCheckMark = mi->menuHasCheckableItems;
#if QT_CONFIG(combobox)
                if (qobject_cast<const QComboBox *>(w))
                    drawCheckMark = false; // ignore the checkmarks provided by the QComboMenuDelegate
#endif
                QSize sz(csz);
                if (subRule.hasFont) {
                    QFontMetrics fm(subRule.font.resolve(mi->font));
                    const QRect r = fm.boundingRect(QRect(), Qt::TextSingleLine | Qt::TextShowMnemonic, mi->text);
                    sz = sz.expandedTo(r.size());
                }
                if (mi->text.contains(u'\t'))
                    sz.rwidth() += 12; //as in QCommonStyle
                if (!mi->icon.isNull()) {
                    const int pmSmall = pixelMetric(PM_SmallIconSize);
                    const QSize pmSize = mi->icon.actualSize(QSize(pmSmall, pmSmall));
                    sz.rwidth() += std::max(mi->maxIconWidth, pmSize.width()) + 4;
                } else if (drawCheckMark) {
                    QRenderRule subSubRule = renderRule(w, opt, PseudoElement_MenuCheckMark);
                    QRect checkmarkRect = positionRect(w, subRule, subSubRule, PseudoElement_MenuCheckMark, opt->rect, opt->direction);
                    sz.rwidth() += std::max(mi->maxIconWidth, checkmarkRect.width()) + 4;
                } else {
                    sz.rwidth() += mi->maxIconWidth;
                }
                return subRule.boxSize(subRule.adjustSize(sz));
            }
        }
        break;

    case CT_Splitter:
    case CT_MenuBarItem: {
        PseudoElement pe = (ct == CT_Splitter) ? PseudoElement_SplitterHandle : PseudoElement_Item;
        QRenderRule subRule = renderRule(w, opt, pe);
        if (subRule.hasBox() || subRule.hasBorder())
            return subRule.boxSize(sz);
        break;
                        }

    case CT_ProgressBar:
    case CT_SizeGrip:
        return (rule.hasContentsSize())
            ? rule.size(sz)
            : rule.boxSize(baseStyle()->sizeFromContents(ct, opt, sz, w));
        break;

    case CT_Slider:
        if (rule.hasBorder() || rule.hasBox() || rule.hasGeometry())
            return rule.boxSize(sz);
        break;

#if QT_CONFIG(tabbar)
    case CT_TabBarTab: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
            int spaceForIcon = 0;
            bool vertical = false;
            QString text;
            if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                if (!tab->icon.isNull())
                    spaceForIcon = 6 /* icon offset */ + 4 /* spacing */ + 2 /* magic */; // ###: hardcoded to match with common style
                vertical = verticalTabs(tab->shape);
                text = tab->text;
            }
            if (subRule.hasBox() || !subRule.hasNativeBorder())
                sz = csz + QSize(vertical ? 0 : spaceForIcon, vertical ? spaceForIcon : 0);
            if (subRule.hasFont) {
                // first we remove the space needed for the text using the default font
                const QSize oldTextSize = opt->fontMetrics.size(Qt::TextShowMnemonic, text);
                (vertical ? sz.rheight() : sz.rwidth()) -= oldTextSize.width();

                // then we add the space needed when using the rule font to the relevant
                // dimension, and constraint the other dimension to the maximum to make
                // sure we don't grow, but also don't clip icons or buttons.
                const QFont ruleFont = subRule.font.resolve(w->font());
                const QFontMetrics fm(ruleFont);
                const QSize textSize = fm.size(Qt::TextShowMnemonic, text);
                if (vertical) {
                    sz.rheight() += textSize.width();
                    sz.rwidth() = qMax(textSize.height(), sz.width());
                } else {
                    sz.rwidth() += textSize.width();
                    sz.rheight() = qMax(textSize.height(), sz.height());
                }
            }

            return subRule.boxSize(subRule.adjustSize(sz));
        }
        sz = subRule.adjustSize(csz);
        break;
    }
#endif // QT_CONFIG(tabbar)

    case CT_MdiControls:
        if (const QStyleOptionComplex *ccOpt = qstyleoption_cast<const QStyleOptionComplex *>(opt)) {
            if (!hasStyleRule(w, PseudoElement_MdiCloseButton)
                && !hasStyleRule(w, PseudoElement_MdiNormalButton)
                && !hasStyleRule(w, PseudoElement_MdiMinButton))
                break;

            QList<QVariant> layout = rule.styleHint("button-layout"_L1).toList();
            if (layout.isEmpty())
                layout = subControlLayout("mNX");

            int width = 0, height = 0;
            for (const QVariant &val : std::as_const(layout)) {
                int layoutButton = val.toInt();
                if (layoutButton < PseudoElement_MdiCloseButton
                    || layoutButton > PseudoElement_MdiNormalButton)
                    continue;
                QStyle::SubControl sc = knownPseudoElements[layoutButton].subControl;
                if (!(ccOpt->subControls & sc))
                    continue;
                QRenderRule subRule = renderRule(w, opt, layoutButton);
                QSize sz = subRule.size();
                width += sz.width();
                height = qMax(height, sz.height());
            }

            return QSize(width, height);
        }
        break;

#if QT_CONFIG(itemviews)
    case CT_ItemViewItem: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_ViewItem);
        sz = baseStyle()->sizeFromContents(ct, opt, csz, w);
        sz = subRule.adjustSize(sz);
        if (subRule.hasBox() || subRule.hasBorder())
            sz = subRule.boxSize(sz);
        return sz;
                      }
#endif // QT_CONFIG(itemviews)

    default:
        break;
    }

    return baseStyle()->sizeFromContents(ct, opt, sz, w);
}